

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.h
# Opt level: O2

int __thiscall CVmRun::pop2_compare_le(CVmRun *this)

{
  int iVar1;
  
  iVar1 = vm_val_t::is_le(sp_ + -2,sp_ + -1);
  sp_ = sp_ + -2;
  return iVar1;
}

Assistant:

int pop2_compare_le(VMG0_)
    {
        /* compare the values and return the result */
        int ret = get(1)->is_le(vmg_ get(0));

        /* discard the values */
        discard(2);

        /* return the result */
        return ret;
    }